

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::
FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
::PerformDefaultAction
          (FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 uVar3;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_01;
  string message;
  long *local_68 [2];
  long local_58 [2];
  ArgumentTuple local_48;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                 *)0x0;
      break;
    }
    this_01 = (OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
               *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    bVar2 = OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 ==
      (OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
       *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_68);
    if (DefaultValue<bool>::producer_ == (long *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*DefaultValue<bool>::producer_ + 0x10))();
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              ::GetAction(this_01);
    local_48.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Tuple_impl<3UL,_pstore::file::file_base::blocking_mode>.
    super__Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>._M_head_impl =
         (_Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>)
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .
         super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .super__Tuple_impl<3UL,_pstore::file::file_base::blocking_mode>.
         super__Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>._M_head_impl;
    local_48.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Head_base<2UL,_pstore::file::file_base::lock_kind,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .
         super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .super__Head_base<2UL,_pstore::file::file_base::lock_kind,_false>._M_head_impl;
    local_48.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    local_48.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    uVar3 = Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::Perform(this_00,&local_48);
  }
  return (Result)uVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }